

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O0

void overlap_remove(bam_plp_t iter,bam1_t *b)

{
  khint_t x;
  uint local_1c;
  khiter_t kitr;
  bam1_t *b_local;
  bam_plp_t iter_local;
  
  if (iter->overlaps != (olap_hash_t *)0x0) {
    if (b == (bam1_t *)0x0) {
      for (local_1c = 0; local_1c < iter->overlaps->n_buckets; local_1c = local_1c + 1) {
        if ((iter->overlaps->flags[local_1c >> 4] >> (sbyte)((local_1c & 0xf) << 1) & 3) == 0) {
          kh_del_olap_hash(iter->overlaps,local_1c);
        }
      }
    }
    else {
      x = kh_get_olap_hash(iter->overlaps,(kh_cstr_t)b->data);
      if (x != iter->overlaps->n_buckets) {
        kh_del_olap_hash(iter->overlaps,x);
      }
    }
  }
  return;
}

Assistant:

static void overlap_remove(bam_plp_t iter, const bam1_t *b)
{
    if ( !iter->overlaps ) return;

    khiter_t kitr;
    if ( b )
    {
        kitr = kh_get(olap_hash, iter->overlaps, bam_get_qname(b));
        if ( kitr!=kh_end(iter->overlaps) )
            kh_del(olap_hash, iter->overlaps, kitr);
    }
    else
    {
        // remove all
        for (kitr = kh_begin(iter->overlaps); kitr<kh_end(iter->overlaps); kitr++)
            if ( kh_exist(iter->overlaps, kitr) ) kh_del(olap_hash, iter->overlaps, kitr);
    }
}